

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroller.cpp
# Opt level: O0

bool __thiscall QtMWidgets::Scroller::eventFilter(Scroller *this,QObject *obj,QEvent *event)

{
  QVariantAnimation *pQVar1;
  byte bVar2;
  Type TVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ScrollerPrivate *pSVar9;
  long lVar10;
  QPoint QVar11;
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
  *this_00;
  double dVar12;
  QPoint local_b0;
  QPoint local_a8;
  QPoint p;
  qreal time;
  QMouseEvent *e_1;
  QVariant local_60;
  QPoint local_40;
  QPoint newPos;
  QMouseEvent *e;
  QEvent *event_local;
  QObject *obj_local;
  Scroller *this_local;
  
  pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
           ::operator->(&this->d);
  if (obj != pSVar9->target) {
    bVar2 = QObject::eventFilter(&this->super_QObject,(QEvent *)obj);
    return (bool)(bVar2 & 1);
  }
  TVar3 = QEvent::type(event);
  if (TVar3 == MouseButtonPress) {
    newPos = QMouseEvent::pos((QMouseEvent *)event);
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->pos = newPos;
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->mousePressed = true;
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->xVelocity = 0.0;
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->yVelocity = 0.0;
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->distance = 0;
    QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
    ::operator->(&this->d);
    QAbstractAnimation::stop();
    QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
    ::operator->(&this->d);
    QElapsedTimer::start();
    return false;
  }
  TVar3 = QEvent::type(event);
  if (TVar3 != MouseButtonRelease) {
    TVar3 = QEvent::type(event);
    if (TVar3 != MouseMove) {
      return false;
    }
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    if ((pSVar9->mousePressed & 1U) == 0) {
      return false;
    }
    QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
    ::operator->(&this->d);
    lVar10 = QElapsedTimer::elapsed();
    p = (QPoint)((double)lVar10 / 1000.0);
    local_b0 = QMouseEvent::pos((QMouseEvent *)event);
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    local_a8 = operator-(&local_b0,&pSVar9->pos);
    iVar5 = QPoint::manhattanLength(&local_a8);
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->distance = iVar5 + pSVar9->distance;
    QVar11 = QMouseEvent::pos((QMouseEvent *)event);
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->pos = QVar11;
    iVar5 = QPoint::manhattanLength(&local_a8);
    if (iVar5 < 6) {
      return false;
    }
    iVar5 = QPoint::x(&local_a8);
    dVar12 = (double)iVar5 / (double)p;
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->xVelocity = dVar12;
    iVar5 = QPoint::y(&local_a8);
    dVar12 = (double)iVar5 / (double)p;
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    pSVar9->yVelocity = dVar12;
    QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
    ::operator->(&this->d);
    QElapsedTimer::restart();
    return false;
  }
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>::
  operator->(&this->d);
  lVar10 = QElapsedTimer::elapsed();
  pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
           ::operator->(&this->d);
  if (lVar10 <= pSVar9->maxPause) {
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    uVar4 = qAbs<int>(&pSVar9->distance);
    pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
             ::operator->(&this->d);
    if (pSVar9->startDragDistance <= uVar4) {
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(&this->d);
      dVar12 = qAbs<double>(&pSVar9->xVelocity);
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(&this->d);
      if (dVar12 < (double)pSVar9->minVelocity) {
        pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                 ::operator->(&this->d);
        dVar12 = qAbs<double>(&pSVar9->yVelocity);
        pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                 ::operator->(&this->d);
        if (dVar12 < (double)pSVar9->minVelocity) goto LAB_001bc3c4;
      }
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(&this->d);
      if (pSVar9->maxVelocity != 0) {
        pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                 ::operator->(&this->d);
        dVar12 = qAbs<double>(&pSVar9->xVelocity);
        pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                 ::operator->(&this->d);
        if ((double)pSVar9->maxVelocity < dVar12) {
          pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                   ::operator->(&this->d);
          if (pSVar9->xVelocity <= 0.0) {
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            uVar4 = pSVar9->maxVelocity;
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            pSVar9->xVelocity = -(double)uVar4;
          }
          else {
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            uVar4 = pSVar9->maxVelocity;
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            pSVar9->xVelocity = (double)uVar4;
          }
        }
        pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                 ::operator->(&this->d);
        dVar12 = qAbs<double>(&pSVar9->yVelocity);
        pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                 ::operator->(&this->d);
        if ((double)pSVar9->maxVelocity < dVar12) {
          pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                   ::operator->(&this->d);
          if (pSVar9->yVelocity <= 0.0) {
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            uVar4 = pSVar9->maxVelocity;
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            pSVar9->yVelocity = -(double)uVar4;
          }
          else {
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            uVar4 = pSVar9->maxVelocity;
            pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
                     ::operator->(&this->d);
            pSVar9->yVelocity = (double)uVar4;
          }
        }
      }
      this_00 = &this->d;
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      iVar5 = QPoint::x(&pSVar9->pos);
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      dVar12 = pSVar9->xVelocity;
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      iVar6 = qRound((dVar12 * (double)pSVar9->scrollTime) / 1000.0);
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      iVar7 = QPoint::y(&pSVar9->pos);
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      dVar12 = pSVar9->yVelocity;
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      iVar8 = qRound((dVar12 * (double)pSVar9->scrollTime) / 1000.0);
      QPoint::QPoint(&local_40,iVar5 + iVar6,iVar7 + iVar8);
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      pQVar1 = pSVar9->scrollAnimation;
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(this_00);
      QVariant::QVariant(&local_60,(QPoint *)&pSVar9->pos);
      QVariantAnimation::setStartValue((QVariant *)pQVar1);
      QVariant::~QVariant(&local_60);
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(&this->d);
      pQVar1 = pSVar9->scrollAnimation;
      QVariant::QVariant((QVariant *)&e_1,(QPoint *)&local_40);
      QVariantAnimation::setEndValue((QVariant *)pQVar1);
      QVariant::~QVariant((QVariant *)&e_1);
      aboutToStart(this);
      pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
               ::operator->(&this->d);
      QAbstractAnimation::start(pSVar9->scrollAnimation,0);
    }
  }
LAB_001bc3c4:
  QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>::
  operator->(&this->d);
  QElapsedTimer::invalidate();
  pSVar9 = QScopedPointer<QtMWidgets::ScrollerPrivate,_QScopedPointerDeleter<QtMWidgets::ScrollerPrivate>_>
           ::operator->(&this->d);
  pSVar9->mousePressed = false;
  return false;
}

Assistant:

bool
Scroller::eventFilter( QObject * obj, QEvent * event )
{
	if( obj == d->target )
	{
		if( event->type() == QEvent::MouseButtonPress )
		{
			QMouseEvent * e = static_cast< QMouseEvent* > ( event );

			d->pos = e->pos();
			d->mousePressed = true;
			d->xVelocity = 0.0;
			d->yVelocity = 0.0;
			d->distance = 0;

			d->scrollAnimation->stop();

			d->elapsed.start();
		}
		else if( event->type() == QEvent::MouseButtonRelease )
		{
			if( d->elapsed.elapsed() <= d->maxPause &&
				(uint) qAbs( d->distance ) >= d->startDragDistance )
			{
				if( qAbs( d->xVelocity ) >= d->minVelocity ||
					qAbs( d->yVelocity ) >= d->minVelocity )
				{
					if( d->maxVelocity > 0 )
					{
						if( qAbs( d->xVelocity ) > d->maxVelocity )
						{
							if( d->xVelocity > 0 )
								d->xVelocity = (qreal) d->maxVelocity;
							else
								d->xVelocity = - (qreal) d->maxVelocity;
						}

						if( qAbs( d->yVelocity ) > d->maxVelocity )
						{
							if( d->yVelocity > 0 )
								d->yVelocity = (qreal) d->maxVelocity;
							else
								d->yVelocity = - (qreal) d->maxVelocity;
						}
					}

					const QPoint newPos = QPoint(
						d->pos.x() + qRound( d->xVelocity * d->scrollTime / 1000 ),
						d->pos.y() + qRound( d->yVelocity * d->scrollTime / 1000 ) );

					d->scrollAnimation->setStartValue( d->pos );
					d->scrollAnimation->setEndValue( newPos );

					emit aboutToStart();

					d->scrollAnimation->start();
				}
			}

			d->elapsed.invalidate();
			d->mousePressed = false;
		}
		else if( event->type() == QEvent::MouseMove )
		{
			if( d->mousePressed )
			{
				QMouseEvent * e = static_cast< QMouseEvent* > ( event );

				const qreal time = (qreal) d->elapsed.elapsed() / 1000.0;

				const QPoint p = e->pos() - d->pos;

				d->distance += p.manhattanLength();

				d->pos = e->pos();

				if( p.manhattanLength() > 5 )
				{
					d->xVelocity = (qreal) p.x() / time;
					d->yVelocity = (qreal) p.y() / time;

					d->elapsed.restart();
				}
			}
		}

		return false;
	}
	else
		return QObject::eventFilter( obj, event );
}